

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O1

Identifier * __thiscall psy::C::SemanticModel::freshSyntheticTag(SemanticModel *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false> _Var2;
  size_type sVar3;
  pointer ppVar4;
  bool bVar5;
  char cVar6;
  long *plVar7;
  Identifier *this_00;
  ulong uVar8;
  ulong *puVar9;
  char cVar10;
  ulong __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tag;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
  p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
  local_48;
  
  _Var2._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
       .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>._M_head_impl;
  __val = ((long)*(pointer *)((long)&(_Var2._M_head_impl)->syntheticTags_ + 8) -
           *(long *)&((_Var2._M_head_impl)->syntheticTags_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>_>_>
          >> 3) * -0x3333333333333333;
  cVar10 = '\x01';
  if (9 < __val) {
    uVar8 = __val;
    cVar6 = '\x04';
    do {
      cVar10 = cVar6;
      if (uVar8 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_002f1d13;
      }
      if (uVar8 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_002f1d13;
      }
      if (uVar8 < 10000) goto LAB_002f1d13;
      bVar5 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar6 = cVar10 + '\x04';
    } while (bVar5);
    cVar10 = cVar10 + '\x01';
  }
LAB_002f1d13:
  paVar1 = &local_48.first.field_2;
  local_48.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_48.first._M_dataplus._M_p,(uint)local_48.first._M_string_length,__val);
  plVar7 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_48,0,(char *)0x0,
                              (ulong)SemanticModelImpl::syntheticTagPrefix__abi_cxx11_._M_dataplus.
                                     _M_p);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_58._M_allocated_capacity = *puVar9;
    local_58._8_8_ = plVar7[3];
    local_68 = &local_58;
  }
  else {
    local_58._M_allocated_capacity = *puVar9;
    local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar7;
  }
  sVar3 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p,local_48.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_68 == &local_58) {
    local_48.first.field_2._8_8_ = local_58._8_8_;
    local_48.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_48.first._M_dataplus._M_p = (pointer)local_68;
  }
  local_48.first.field_2._M_allocated_capacity = local_58._M_allocated_capacity;
  local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
  local_48.second = (Identifier *)0x0;
  local_48.first._M_string_length = sVar3;
  std::
  vector<std::pair<std::__cxx11::string,psy::C::Identifier*>,std::allocator<std::pair<std::__cxx11::string,psy::C::Identifier*>>>
  ::emplace_back<std::pair<std::__cxx11::string,psy::C::Identifier*>>
            ((vector<std::pair<std::__cxx11::string,psy::C::Identifier*>,std::allocator<std::pair<std::__cxx11::string,psy::C::Identifier*>>>
              *)&((this->impl_)._M_t.
                  super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                  .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                 _M_head_impl)->syntheticTags_,&local_48);
  this_00 = (Identifier *)operator_new(0x30);
  ppVar4 = *(pointer *)
            ((long)&((this->impl_)._M_t.
                     super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                     .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                    _M_head_impl)->syntheticTags_ + 8);
  Identifier::Identifier
            (this_00,*(char **)&ppVar4[0xffffffffffffffff].first,
             *(uint *)((long)(ppVar4 + 0xffffffffffffffff) + 8));
  *(Identifier **)
   ((long)(*(pointer *)
            ((long)&((this->impl_)._M_t.
                     super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                     .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                    _M_head_impl)->syntheticTags_ + 8) + 0xffffffffffffffff) + 0x20) = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p,local_48.first.field_2._M_allocated_capacity + 1
                   );
  }
  return this_00;
}

Assistant:

const Identifier* SemanticModel::freshSyntheticTag()
{
    auto tag = P->syntheticTagPrefix_ + std::to_string(P->syntheticTags_.size());
    std::pair<std::string, Identifier*> p(std::move(tag), nullptr);
    P->syntheticTags_.emplace_back(std::move(p));
    auto ident = new Identifier(
                P->syntheticTags_.back().first.c_str(),
                P->syntheticTags_.back().first.length());
    P->syntheticTags_.back().second = ident;
    return ident;
}